

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::LogicalGet::Deserialize(Deserializer *deserializer)

{
  bool bVar1;
  undefined1 uVar2;
  pointer pLVar3;
  undefined8 uVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pLVar7;
  TableFunctionInfo *ptr_p;
  pointer pLVar8;
  pointer pFVar9;
  pointer ppVar10;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  value_type *col_name_1;
  value_type *ret_type_1;
  idx_t idx_1;
  string *col_name;
  LogicalType *ret_type;
  iterator ventry;
  idx_t idx;
  ColumnIndex *col_id_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::ColumnIndex,_true> *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  bind_names;
  vector<duckdb::LogicalType,_true> bind_return_types;
  TableFunctionBindInput input;
  TableFunctionRef empty_ref;
  virtual_column_map_t virtual_columns;
  ClientContext *context;
  unsigned_long *col_id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_true> *__range2;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  bool has_serialize;
  TableFunction *function;
  pair<duckdb::TableFunction,_bool> entry;
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> result;
  vector<unsigned_long,_true> legacy_column_ids;
  pointer in_stack_fffffffffffff748;
  TableFunction *in_stack_fffffffffffff750;
  unsigned_long *in_stack_fffffffffffff758;
  Deserializer *in_stack_fffffffffffff760;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff768;
  char *in_stack_fffffffffffff770;
  TableFilterSet *in_stack_fffffffffffff778;
  table_function_get_virtual_columns_t p_Var11;
  Deserializer *in_stack_fffffffffffff780;
  ClientContext *pCVar12;
  string *in_stack_fffffffffffff788;
  Deserializer *in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  field_id_t field_id;
  Deserializer *in_stack_fffffffffffff7a0;
  allocator *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b0;
  string *in_stack_fffffffffffff7b8;
  LogicalGet *in_stack_fffffffffffff7c0;
  TableFunction *in_stack_fffffffffffff7d0;
  Deserializer *in_stack_fffffffffffff7d8;
  LogicalType *in_stack_fffffffffffff818;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
  in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  SerializationException *in_stack_fffffffffffff840;
  optional_ptr<duckdb::FunctionData,_true> local_640 [2];
  CatalogType in_stack_fffffffffffff9d7;
  Deserializer *in_stack_fffffffffffff9d8;
  string local_5c8 [32];
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  reference local_560;
  reference local_558;
  idx_t local_550;
  undefined1 local_541;
  string local_510 [32];
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [32];
  string *local_4a8;
  LogicalType *local_4a0;
  undefined1 local_492;
  allocator local_491;
  string local_490 [32];
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_470;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  ColumnIndex *local_458;
  ColumnIndex *local_450;
  __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
  local_448;
  vector<duckdb::ColumnIndex,_true> *local_440;
  optional_ptr<duckdb::FunctionData,_true> local_438;
  undefined1 local_430 [56];
  undefined1 local_3f8 [55];
  allocator local_3c1;
  string local_3c0 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_388;
  optional_ptr<duckdb::Binder,_true> local_370;
  __node_base local_368;
  TableFunctionBindInput local_360;
  TableFunctionRef local_320;
  ClientContext *local_270;
  reference local_268;
  __node_base_ptr local_260;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_258;
  undefined1 *local_250;
  undefined1 local_242;
  allocator local_241;
  string local_240 [55];
  byte local_209;
  TableFunction *local_208;
  byte local_48;
  undefined1 local_28 [40];
  
  field_id = (field_id_t)((ulong)in_stack_fffffffffffff798 >> 0x30);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0xe5eba7);
  operator_new(0x3d8);
  LogicalGet(in_stack_fffffffffffff7c0);
  unique_ptr<duckdb::LogicalGet,std::default_delete<duckdb::LogicalGet>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalGet>,void>
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<unsigned_long>
            (in_stack_fffffffffffff760,(field_id_t)((ulong)in_stack_fffffffffffff758 >> 0x30),
             (char *)in_stack_fffffffffffff750,(unsigned_long *)in_stack_fffffffffffff748);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
             in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
             in_stack_fffffffffffff770,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffff768);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (in_stack_fffffffffffff790,(field_id_t)((ulong)in_stack_fffffffffffff788 >> 0x30),
             (char *)in_stack_fffffffffffff780,
             (vector<unsigned_long,_true> *)in_stack_fffffffffffff778);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
             in_stack_fffffffffffff770,(vector<unsigned_long,_true> *)in_stack_fffffffffffff768);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<duckdb::TableFilterSet>
            (in_stack_fffffffffffff790,(field_id_t)((ulong)in_stack_fffffffffffff788 >> 0x30),
             (char *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  FunctionSerializer::DeserializeBase<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d7);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  TableFunction::operator=(in_stack_fffffffffffff750,(TableFunction *)in_stack_fffffffffffff748);
  pLVar3 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                     ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                       *)in_stack_fffffffffffff750);
  local_208 = &pLVar3->function;
  local_209 = local_48 & 1;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0xe5ee42);
  if ((local_209 & 1) == 0) {
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
              (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
               in_stack_fffffffffffff770,(vector<duckdb::Value,_true> *)in_stack_fffffffffffff768);
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    Deserializer::
    ReadProperty<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              (in_stack_fffffffffffff7a0,field_id,(char *)in_stack_fffffffffffff790,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)in_stack_fffffffffffff788);
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
              (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
               in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
              (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
               in_stack_fffffffffffff770,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_fffffffffffff768);
  }
  else {
    FunctionSerializer::FunctionDeserialize<duckdb::TableFunction>
              (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator=
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffff750,
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffff748);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               0xe5f064);
  }
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (in_stack_fffffffffffff780,(field_id_t)((ulong)in_stack_fffffffffffff778 >> 0x30),
             in_stack_fffffffffffff770,(vector<unsigned_long,_true> *)in_stack_fffffffffffff768);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (in_stack_fffffffffffff790,(field_id_t)((ulong)in_stack_fffffffffffff788 >> 0x30),
             (char *)in_stack_fffffffffffff780,
             (vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffff778);
  bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff760);
  if (!bVar1) {
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    bVar1 = ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::empty
                      ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                       in_stack_fffffffffffff760);
    if (!bVar1) {
      local_242 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_240,
                 "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both"
                 ,&local_241);
      SerializationException::SerializationException
                ((SerializationException *)in_stack_fffffffffffff750,
                 (string *)in_stack_fffffffffffff748);
      local_242 = 0;
      __cxa_throw(uVar4,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    local_250 = local_28;
    local_258._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff748);
    local_260 = (__node_base_ptr)
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff748);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffff750,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffff748), bVar1) {
      local_268 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_258);
      unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
                 in_stack_fffffffffffff750);
      ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
      emplace_back<unsigned_long&>
                ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                 in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_258);
    }
  }
  local_270 = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)0xe5f2fb);
  ::std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                   *)0xe5f322);
  if ((local_209 & 1) == 0) {
    TableFunctionRef::TableFunctionRef((TableFunctionRef *)in_stack_fffffffffffff750);
    pLVar3 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    pLVar5 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    pLVar6 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    pLVar7 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    ptr_p = shared_ptr<duckdb::TableFunctionInfo,_true>::get
                      ((shared_ptr<duckdb::TableFunctionInfo,_true> *)0xe5f407);
    optional_ptr<duckdb::TableFunctionInfo,_true>::optional_ptr
              ((optional_ptr<duckdb::TableFunctionInfo,_true> *)&local_368,ptr_p);
    optional_ptr<duckdb::Binder,_true>::optional_ptr(&local_370,(Binder *)0x0);
    pLVar8 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    in_stack_fffffffffffff750 = &pLVar8->function;
    TableFunctionBindInput::TableFunctionBindInput
              (&local_360,&pLVar3->parameters,&pLVar5->named_parameters,&pLVar6->input_table_types,
               &pLVar7->input_table_names,
               (optional_ptr<duckdb::TableFunctionInfo,_true>)local_368._M_nxt,local_370,
               in_stack_fffffffffffff750,&local_320);
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xe5f4c0);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)0xe5f4cd);
    if (local_208->bind == (table_function_bind_t)0x0) {
      local_3f8[0xf] = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_3c0,"Table function \"%s\" has neither bind nor (de)serialize",&local_3c1);
      ::std::__cxx11::string::string
                ((string *)(local_3f8 + 0x10),
                 (string *)
                 &(local_208->super_SimpleNamedParameterFunction).super_SimpleFunction.
                  super_Function.name);
      InternalException::InternalException<std::__cxx11::string>
                ((InternalException *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                 in_stack_fffffffffffff7b0);
      local_3f8[0xf] = 0;
      __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
    }
    (*local_208->bind)((ClientContext *)local_3f8,(TableFunctionBindInput *)local_270,
                       (vector<duckdb::LogicalType,_true> *)&local_360,&local_388);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator=
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffff750,
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               local_370.ptr);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               0xe5f6a6);
    pCVar12 = local_270;
    in_stack_fffffffffffff748 = (pointer)local_370.ptr;
    if (local_208->get_virtual_columns != (table_function_get_virtual_columns_t)0x0) {
      in_stack_fffffffffffff840 = (SerializationException *)local_208->get_virtual_columns;
      pFVar9 = ::std::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>::
               get((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *)
                   in_stack_fffffffffffff750);
      optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_438,pFVar9);
      (*(code *)in_stack_fffffffffffff840)(local_430,pCVar12,local_438.ptr);
      ::std::
      unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
      ::operator=((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                   *)in_stack_fffffffffffff750,
                  (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                   *)local_370.ptr);
      ::std::
      unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                        *)0xe5f748);
      in_stack_fffffffffffff748 = (pointer)local_370.ptr;
    }
    pLVar3 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
             operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                         *)in_stack_fffffffffffff750);
    local_440 = &pLVar3->column_ids;
    local_448._M_current =
         (ColumnIndex *)
         ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::begin
                   ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                    in_stack_fffffffffffff748);
    local_450 = (ColumnIndex *)
                ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::end
                          ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                           in_stack_fffffffffffff748);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                               *)in_stack_fffffffffffff750,
                              (__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                               *)in_stack_fffffffffffff748), bVar1) {
      local_458 = __gnu_cxx::
                  __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                  ::operator*(&local_448);
      uVar2 = ColumnIndex::IsVirtualColumn(local_458);
      if ((bool)uVar2) {
        in_stack_fffffffffffff828 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ColumnIndex::GetPrimaryIndex(local_458);
        local_460 = in_stack_fffffffffffff828;
        in_stack_fffffffffffff820._M_cur =
             (__node_type *)
             ::std::
             unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
             ::find((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                     *)in_stack_fffffffffffff748,(key_type *)0xe5f84f);
        local_468._M_cur = in_stack_fffffffffffff820._M_cur;
        local_470._M_cur =
             (__node_type *)
             ::std::
             unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
             ::end((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                    *)in_stack_fffffffffffff748);
        bVar1 = ::std::__detail::operator==(&local_468,&local_470);
        if (bVar1) {
          local_492 = 1;
          uVar4 = __cxa_allocate_exception(0x10);
          paVar13 = &local_491;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_490,
                     "Table function deserialization failure - could not find virtual column with id %d"
                     ,paVar13);
          SerializationException::SerializationException<unsigned_long>
                    ((SerializationException *)in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                     (unsigned_long)in_stack_fffffffffffff780);
          local_492 = 0;
          __cxa_throw(uVar4,&SerializationException::typeinfo,
                      SerializationException::~SerializationException);
        }
        ppVar10 = ::std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                                *)0xe5f9a7);
        local_4a0 = &(ppVar10->second).type;
        ppVar10 = ::std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false,_false>
                                *)0xe5f9c0);
        local_4a8 = (string *)&ppVar10->second;
        vector<duckdb::LogicalType,_true>::operator[]
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
                   (size_type)in_stack_fffffffffffff748);
        bVar1 = LogicalType::operator!=
                          ((LogicalType *)in_stack_fffffffffffff750,
                           (LogicalType *)in_stack_fffffffffffff748);
        if (bVar1) {
          local_541 = 1;
          uVar4 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_4c8,
                     "Table function deserialization failure in function \"%s\" - virtual column with name %s was serialized with type %s, but now has type %s"
                     ,&local_4c9);
          ::std::__cxx11::string::string
                    (local_4f0,
                     (string *)
                     &(local_208->super_SimpleNamedParameterFunction).super_SimpleFunction.
                      super_Function.name);
          ::std::__cxx11::string::string(local_510,local_4a8);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff750,
                     (LogicalType *)in_stack_fffffffffffff748);
          vector<duckdb::LogicalType,_true>::operator[]
                    ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
                     (size_type)in_stack_fffffffffffff748);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff750,
                     (LogicalType *)in_stack_fffffffffffff748);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (in_stack_fffffffffffff840,(string *)pLVar3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffff830),in_stack_fffffffffffff828,
                     (LogicalType *)in_stack_fffffffffffff820._M_cur,in_stack_fffffffffffff818);
          local_541 = 0;
          __cxa_throw(uVar4,&SerializationException::typeinfo,
                      SerializationException::~SerializationException);
        }
      }
      else {
        local_550 = ColumnIndex::GetPrimaryIndex(local_458);
        unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                  ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
                   in_stack_fffffffffffff750);
        local_558 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
                               (size_type)in_stack_fffffffffffff748);
        unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                  ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
                   in_stack_fffffffffffff750);
        local_560 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
        vector<duckdb::LogicalType,_true>::operator[]
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
                   (size_type)in_stack_fffffffffffff748);
        bVar1 = LogicalType::operator!=
                          ((LogicalType *)in_stack_fffffffffffff750,
                           (LogicalType *)in_stack_fffffffffffff748);
        if (bVar1) {
          uVar4 = __cxa_allocate_exception(0x10);
          paVar13 = &local_581;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_580,
                     "Table function deserialization failure in function \"%s\" - column with name %s was serialized with type %s, but now has type %s"
                     ,paVar13);
          ::std::__cxx11::string::string
                    (local_5a8,
                     (string *)
                     &(local_208->super_SimpleNamedParameterFunction).super_SimpleFunction.
                      super_Function.name);
          ::std::__cxx11::string::string(local_5c8,(string *)local_560);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff750,
                     (LogicalType *)in_stack_fffffffffffff748);
          vector<duckdb::LogicalType,_true>::operator[]
                    ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
                     (size_type)in_stack_fffffffffffff748);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffff750,
                     (LogicalType *)in_stack_fffffffffffff748);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (in_stack_fffffffffffff840,(string *)pLVar3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffff830),in_stack_fffffffffffff828,
                     (LogicalType *)in_stack_fffffffffffff820._M_cur,in_stack_fffffffffffff818);
          __cxa_throw(uVar4,&SerializationException::typeinfo,
                      SerializationException::~SerializationException);
        }
      }
      __gnu_cxx::
      __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
      ::operator++(&local_448);
    }
    unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
              ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
               in_stack_fffffffffffff750);
    vector<duckdb::LogicalType,_true>::operator=
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff750,
               (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff748);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0xe5ff87);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe5ff94);
    TableFunctionRef::~TableFunctionRef((TableFunctionRef *)in_stack_fffffffffffff750);
  }
  else if (local_208->get_virtual_columns != (table_function_get_virtual_columns_t)0x0) {
    p_Var11 = local_208->get_virtual_columns;
    pCVar12 = local_270;
    pFVar9 = ::std::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>::
             get((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *)
                 in_stack_fffffffffffff750);
    optional_ptr<duckdb::FunctionData,_true>::optional_ptr(local_640,pFVar9);
    (*p_Var11)((virtual_column_map_t *)(local_640 + 1),pCVar12,
               (optional_ptr<duckdb::FunctionData,_true>)local_640[0].ptr);
    ::std::
    unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
    ::operator=((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                 *)in_stack_fffffffffffff750,
                (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                 *)in_stack_fffffffffffff748);
    ::std::
    unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                      *)0xe60068);
  }
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  ::std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::operator=((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
               *)in_stack_fffffffffffff750,
              (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
               *)in_stack_fffffffffffff748);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             in_stack_fffffffffffff750);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator=
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffff750,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffff748);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalGet,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffff750,
             (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_> *)
             in_stack_fffffffffffff748);
  ::std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                    *)0xe600e6);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0xe600f3);
  ::std::pair<duckdb::TableFunction,_bool>::~pair((pair<duckdb::TableFunction,_bool> *)0xe60100);
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::~unique_ptr
            ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
             0xe6010d);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xe6011a);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> LogicalGet::Deserialize(Deserializer &deserializer) {
	vector<column_t> legacy_column_ids;

	auto result = unique_ptr<LogicalGet>(new LogicalGet());
	deserializer.ReadProperty(200, "table_index", result->table_index);
	deserializer.ReadProperty(201, "returned_types", result->returned_types);
	deserializer.ReadProperty(202, "names", result->names);
	deserializer.ReadPropertyWithDefault(203, "column_ids", legacy_column_ids);
	deserializer.ReadProperty(204, "projection_ids", result->projection_ids);
	deserializer.ReadProperty(205, "table_filters", result->table_filters);
	auto entry = FunctionSerializer::DeserializeBase<TableFunction, TableFunctionCatalogEntry>(
	    deserializer, CatalogType::TABLE_FUNCTION_ENTRY);
	result->function = entry.first;
	auto &function = result->function;
	auto has_serialize = entry.second;
	unique_ptr<FunctionData> bind_data;
	if (!has_serialize) {
		deserializer.ReadProperty(206, "parameters", result->parameters);
		deserializer.ReadProperty(207, "named_parameters", result->named_parameters);
		deserializer.ReadProperty(208, "input_table_types", result->input_table_types);
		deserializer.ReadProperty(209, "input_table_names", result->input_table_names);
	} else {
		bind_data = FunctionSerializer::FunctionDeserialize(deserializer, function);
	}
	deserializer.ReadProperty(210, "projected_input", result->projected_input);
	deserializer.ReadPropertyWithDefault(211, "column_indexes", result->column_ids);
	if (!legacy_column_ids.empty()) {
		if (!result->column_ids.empty()) {
			throw SerializationException(
			    "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both");
		}
		for (auto &col_id : legacy_column_ids) {
			result->column_ids.emplace_back(col_id);
		}
	}
	auto &context = deserializer.Get<ClientContext &>();
	virtual_column_map_t virtual_columns;
	if (!has_serialize) {
		TableFunctionRef empty_ref;
		TableFunctionBindInput input(result->parameters, result->named_parameters, result->input_table_types,
		                             result->input_table_names, function.function_info.get(), nullptr, result->function,
		                             empty_ref);

		vector<LogicalType> bind_return_types;
		vector<string> bind_names;
		if (!function.bind) {
			throw InternalException("Table function \"%s\" has neither bind nor (de)serialize", function.name);
		}
		bind_data = function.bind(context, input, bind_return_types, bind_names);
		if (function.get_virtual_columns) {
			virtual_columns = function.get_virtual_columns(context, bind_data.get());
		}

		for (auto &col_id : result->column_ids) {
			if (col_id.IsVirtualColumn()) {
				auto idx = col_id.GetPrimaryIndex();
				auto ventry = virtual_columns.find(idx);
				if (ventry == virtual_columns.end()) {
					throw SerializationException(
					    "Table function deserialization failure - could not find virtual column with id %d", idx);
				}
				auto &ret_type = ventry->second.type;
				auto &col_name = ventry->second.name;
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - virtual column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			} else {
				auto idx = col_id.GetPrimaryIndex();
				auto &ret_type = result->returned_types[idx];
				auto &col_name = result->names[idx];
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			}
		}
		result->returned_types = std::move(bind_return_types);
	} else if (function.get_virtual_columns) {
		virtual_columns = function.get_virtual_columns(context, bind_data.get());
	}
	result->virtual_columns = std::move(virtual_columns);
	result->bind_data = std::move(bind_data);
	return std::move(result);
}